

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satClause.h
# Opt level: O2

int Sat_MemAppend(Sat_Mem_t *p,int *pArray,int nSize,int lrn,int fPlus1)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  int **__ptr;
  int *piVar4;
  int iVar5;
  int iVar6;
  
  iVar3 = (nSize + 2 + lrn) / 2;
  iVar6 = 1 << ((byte)p->nPageSize & 0x1f);
  if (iVar3 * 2 + 3 < iVar6) {
    __ptr = p->pPages;
    piVar4 = __ptr[p->iPage[(uint)lrn]];
    iVar5 = *piVar4;
    if (iVar6 <= iVar3 * 2 + iVar5 + 2) {
      iVar6 = p->iPage[(uint)lrn] + 2;
      p->iPage[(uint)lrn] = iVar6;
      if (p->nPagesAlloc <= iVar6) {
        __ptr = (int **)realloc(__ptr,(long)p->nPagesAlloc << 4);
        p->pPages = __ptr;
        iVar6 = p->nPagesAlloc;
        memset(__ptr + iVar6,0,(long)iVar6 << 3);
        p->nPagesAlloc = iVar6 * 2;
        iVar6 = p->iPage[(uint)lrn];
      }
      piVar4 = __ptr[iVar6];
      if (piVar4 == (int *)0x0) {
        piVar4 = (int *)malloc((0x100000000 << ((byte)p->nPageSize & 0x3f)) >> 0x1e);
        __ptr[iVar6] = piVar4;
        piVar4 = p->pPages[iVar6];
      }
      iVar5 = 2;
      *piVar4 = 2;
    }
    piVar4[iVar5] = 0;
    puVar1 = (uint *)(piVar4 + *piVar4);
    *puVar1 = lrn & 1U | *puVar1 & 0x7fe | nSize << 0xb;
    if (pArray != (int *)0x0) {
      memcpy(puVar1 + 1,pArray,(long)nSize << 2);
    }
    uVar2 = p->nEntries[(uint)lrn];
    if (lrn != 0) {
      puVar1[(ulong)(nSize & 0x1fffff) + 1] = uVar2;
    }
    p->nEntries[(uint)lrn] = uVar2 + 1;
    *piVar4 = *piVar4 + iVar3 * 2;
    return (p->iPage[(uint)lrn] << ((byte)p->nPageSize & 0x1f) | *p->pPages[p->iPage[(uint)lrn]]) +
           iVar3 * -2;
  }
  __assert_fail("nInts + 3 < (1 << p->nPageSize)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satClause.h"
                ,0x133,"int Sat_MemAppend(Sat_Mem_t *, int *, int, int, int)");
}

Assistant:

static inline int Sat_MemAppend( Sat_Mem_t * p, int * pArray, int nSize, int lrn, int fPlus1 )
{
    clause * c;
    int * pPage = p->pPages[p->iPage[lrn]];
    int nInts = Sat_MemIntSize( nSize, lrn | fPlus1 );
    assert( nInts + 3 < (1 << p->nPageSize) );
    // need two extra at the begining of the page and one extra in the end
    if ( Sat_MemLimit(pPage) + nInts + 2 >= (1 << p->nPageSize) )
    { 
        p->iPage[lrn] += 2;
        if ( p->iPage[lrn] >= p->nPagesAlloc )
        {
            p->pPages = ABC_REALLOC( int *, p->pPages, p->nPagesAlloc * 2 );
            memset( p->pPages + p->nPagesAlloc, 0, sizeof(int *) * p->nPagesAlloc );
            p->nPagesAlloc *= 2;
        }
        if ( p->pPages[p->iPage[lrn]] == NULL )
            p->pPages[p->iPage[lrn]] = ABC_ALLOC( int, (int)(((word)1) << p->nPageSize) );
        pPage = p->pPages[p->iPage[lrn]];
        Sat_MemWriteLimit( pPage, 2 );
    }
    pPage[Sat_MemLimit(pPage)] = 0;
    c = (clause *)(pPage + Sat_MemLimit(pPage));
    c->size = nSize;
    c->lrn = lrn;
    if ( pArray )
        memcpy( c->lits, pArray, sizeof(int) * nSize );
    if ( lrn | fPlus1 )
        c->lits[c->size] = p->nEntries[lrn];
    p->nEntries[lrn]++;
    Sat_MemIncLimit( pPage, nInts );
    return Sat_MemHandCurrent(p, lrn) - nInts;
}